

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O1

bool __thiscall
adios2sys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,CommandLineArgumentsCallbackStructure *cs,char *value)

{
  size_type *psVar1;
  undefined4 *puVar2;
  double *pdVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  CommandLineArguments *this_00;
  CommandLineArguments *pCVar8;
  double dVar9;
  string var;
  char *res;
  undefined1 local_58 [32];
  char *local_38;
  
  this_00 = (CommandLineArguments *)local_58;
  pCVar8 = (CommandLineArguments *)local_58;
  if ((cs->Callback != (CallbackType)0x0) &&
     (iVar5 = (*cs->Callback)(cs->Argument,value,cs->CallData), iVar5 == 0)) {
    psVar1 = &this->Internals->LastArgument;
    *psVar1 = *psVar1 - 1;
    goto LAB_00735046;
  }
  if (cs->Variable == (void *)0x0) goto LAB_00735042;
  local_58._0_8_ = (Internal *)(local_58 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"1","");
  if (value != (char *)0x0) {
    strlen(value);
    std::__cxx11::string::_M_replace((ulong)local_58,0,(char *)local_58._8_8_,(ulong)value);
    this_00 = pCVar8;
  }
  switch(cs->VariableType) {
  case 1:
    puVar2 = (undefined4 *)cs->Variable;
    local_38 = (char *)0x0;
    lVar6 = strtol((char *)local_58._0_8_,&local_38,10);
    *puVar2 = (int)lVar6;
    goto LAB_00734f87;
  case 2:
    PopulateVariable(this_00,(bool *)cs->Variable,(string *)local_58);
    goto LAB_00734f87;
  case 3:
    pdVar3 = (double *)cs->Variable;
    local_38 = (char *)0x0;
    dVar9 = strtod((char *)local_58._0_8_,&local_38);
    *pdVar3 = dVar9;
LAB_00734f87:
    bVar4 = true;
    break;
  case 4:
    bVar4 = true;
    PopulateVariable(this_00,(char **)cs->Variable,(string *)local_58);
    break;
  case 5:
    bVar4 = true;
    std::__cxx11::string::_M_assign((string *)cs->Variable);
    break;
  case 6:
    bVar4 = true;
    PopulateVariable(this_00,(vector<int,_std::allocator<int>_> *)cs->Variable,(string *)local_58);
    break;
  case 7:
    bVar4 = true;
    PopulateVariable(this_00,(vector<bool,_std::allocator<bool>_> *)cs->Variable,(string *)local_58)
    ;
    break;
  case 8:
    bVar4 = true;
    PopulateVariable(this_00,(vector<double,_std::allocator<double>_> *)cs->Variable,
                     (string *)local_58);
    break;
  case 9:
    bVar4 = true;
    PopulateVariable(this_00,(vector<char_*,_std::allocator<char_*>_> *)cs->Variable,
                     (string *)local_58);
    break;
  case 10:
    bVar4 = true;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)cs->Variable,(value_type *)local_58);
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Got unknown variable type: \"",0x1c);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,cs->VariableType);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    psVar1 = &this->Internals->LastArgument;
    *psVar1 = *psVar1 - 1;
    bVar4 = false;
  }
  if ((Internal *)local_58._0_8_ != (Internal *)(local_58 + 0x10)) {
    operator_delete((void *)local_58._0_8_);
  }
  if (bVar4) {
LAB_00735042:
    bVar4 = true;
  }
  else {
LAB_00735046:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool CommandLineArguments::PopulateVariable(
  CommandLineArgumentsCallbackStructure* cs, const char* value)
{
  // Call the callback
  if (cs->Callback) {
    if (!cs->Callback(cs->Argument, value, cs->CallData)) {
      this->Internals->LastArgument--;
      return false;
    }
  }
  CommandLineArguments_DEBUG("Set argument: " << cs->Argument << " to "
                                              << value);
  if (cs->Variable) {
    std::string var = "1";
    if (value) {
      var = value;
    }
    switch (cs->VariableType) {
      case CommandLineArguments::INT_TYPE:
        this->PopulateVariable(static_cast<int*>(cs->Variable), var);
        break;
      case CommandLineArguments::DOUBLE_TYPE:
        this->PopulateVariable(static_cast<double*>(cs->Variable), var);
        break;
      case CommandLineArguments::STRING_TYPE:
        this->PopulateVariable(static_cast<char**>(cs->Variable), var);
        break;
      case CommandLineArguments::STL_STRING_TYPE:
        this->PopulateVariable(static_cast<std::string*>(cs->Variable), var);
        break;
      case CommandLineArguments::BOOL_TYPE:
        this->PopulateVariable(static_cast<bool*>(cs->Variable), var);
        break;
      case CommandLineArguments::VECTOR_BOOL_TYPE:
        this->PopulateVariable(static_cast<std::vector<bool>*>(cs->Variable),
                               var);
        break;
      case CommandLineArguments::VECTOR_INT_TYPE:
        this->PopulateVariable(static_cast<std::vector<int>*>(cs->Variable),
                               var);
        break;
      case CommandLineArguments::VECTOR_DOUBLE_TYPE:
        this->PopulateVariable(static_cast<std::vector<double>*>(cs->Variable),
                               var);
        break;
      case CommandLineArguments::VECTOR_STRING_TYPE:
        this->PopulateVariable(static_cast<std::vector<char*>*>(cs->Variable),
                               var);
        break;
      case CommandLineArguments::VECTOR_STL_STRING_TYPE:
        this->PopulateVariable(
          static_cast<std::vector<std::string>*>(cs->Variable), var);
        break;
      default:
        std::cerr << "Got unknown variable type: \"" << cs->VariableType
                  << "\"" << std::endl;
        this->Internals->LastArgument--;
        return false;
    }
  }
  return true;
}